

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O1

void __thiscall
AggressiveBotStrategy::AggressiveBotStrategy(AggressiveBotStrategy *this,Player *player)

{
  int *piVar1;
  Player *this_00;
  string *psVar2;
  
  PlayerStrategy::PlayerStrategy(&this->super_PlayerStrategy);
  (this->super_PlayerStrategy)._vptr_PlayerStrategy = (_func_int **)&PTR_yesOrNo_0013c8c0;
  piVar1 = (int *)operator_new(4);
  *piVar1 = 0;
  (this->super_PlayerStrategy).armiesToPlace = piVar1;
  piVar1 = (int *)operator_new(4);
  *piVar1 = 0;
  (this->super_PlayerStrategy).exchangingCardType = piVar1;
  this_00 = (Player *)operator_new(0x38);
  Player::Player(this_00,player);
  (this->super_PlayerStrategy).player = this_00;
  (this->super_PlayerStrategy).from = (Country *)0x0;
  (this->super_PlayerStrategy).to = (Country *)0x0;
  psVar2 = (string *)operator_new(0x20);
  (psVar2->_M_dataplus)._M_p = (pointer)&psVar2->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)psVar2,"AGGRESSIVE","");
  (this->super_PlayerStrategy).strategyName = psVar2;
  return;
}

Assistant:

AggressiveBotStrategy::AggressiveBotStrategy(const Player& player) {
    this->armiesToPlace = new int(0);
    this->exchangingCardType = new int(0);
    this->player = new Player(player);
    this->from = nullptr;
    this->to = nullptr;
    this->strategyName = new std::string("AGGRESSIVE");
}